

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Am_Object::Remove_Constraint(Am_Object *this,Am_Slot_Key key)

{
  Am_Constraint *proto;
  Am_Constraint_Iterator_Data *constraint_tag;
  int iVar1;
  Am_Slot_Data *pAVar2;
  undefined4 extraout_var;
  Am_Constraint_Iterator iter;
  Am_Slot local_48;
  Am_Constraint_Iterator local_40;
  
  if (this->data == (Am_Object_Data *)0x0) {
    Am_Error("** Remove_Constraint called on a (0L) object");
  }
  pAVar2 = Am_Object_Data::find_slot(this->data,key);
  if ((pAVar2 != (Am_Slot_Data *)0x0) && (pAVar2->context == this->data)) {
    local_48.data = pAVar2;
    Am_Constraint_Iterator::Am_Constraint_Iterator(&local_40,&local_48);
    if (local_40.context.data != (Am_Slot_Data *)0x0) {
      local_40.current = (Am_Constraint_Iterator_Data *)((local_40.context.data)->constraints).head;
    }
    while (constraint_tag = local_40.current, (CItem *)local_40.current != (CItem *)0x0) {
      proto = *(Am_Constraint **)&(local_40.current)->field_0x0;
      local_40.current = *(Am_Constraint_Iterator_Data **)((long)local_40.current + 0x10);
      iVar1 = (*(proto->super_Am_Registered_Type)._vptr_Am_Registered_Type[10])(proto);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        if ((*(ushort *)&pAVar2->field_0x38 & 0x300) == 0x100) {
          Am_Object_Data::prop_remove_constraint(this->data,key,proto);
        }
        local_48.data = pAVar2;
        Am_Slot::Remove_Constraint(&local_48,constraint_tag);
      }
    }
  }
  return;
}

Assistant:

void
Am_Object::Remove_Constraint(Am_Slot_Key key)
{
  if (!data)
    Am_Error("** Remove_Constraint called on a (0L) object");
  Am_Slot_Data *slot = data->find_slot(key);
  if (slot && slot->context == data) {
    Am_Constraint *constraint;
    Am_Constraint_Tag tag;
    Am_Constraint_Iterator iter((const Am_Slot &)slot);
    iter.Start();
    while (!iter.Last()) {
      constraint = iter.Get();
      tag = iter.Get_Tag();
      iter.Next();
      if (constraint->Get_Prototype() == nullptr) {
        if (slot->rule == Am_INHERIT)
          data->prop_remove_constraint(key, constraint);
        Am_Slot(slot).Remove_Constraint(tag);
      }
    }
  }
}